

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

size_t __thiscall
MADPComponentDiscreteActions::GetNrJointActions(MADPComponentDiscreteActions *this,Scope *agScope)

{
  unsigned_long uVar1;
  long lVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> restr_nrAs;
  allocator_type local_31;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  lVar2 = (long)(agScope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(agScope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 == 0) {
    uVar1 = 0;
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,lVar2 >> 2,
               &local_31);
    IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
              (&this->_m_nrActions,agScope,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30);
    uVar1 = VectorTools::VectorProduct<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
  }
  return uVar1;
}

Assistant:

size_t MADPComponentDiscreteActions::GetNrJointActions(const Scope& agScope) const
{
    if(agScope.size()>0)
    {
        const vector<size_t>& nrActions = GetNrActions();
        vector<size_t> restr_nrAs(agScope.size());
        IndexTools::RestrictIndividualIndicesToScope(
            nrActions, agScope, restr_nrAs);
        size_t restr_nrJA = VectorTools::VectorProduct(restr_nrAs);
        return restr_nrJA;
    }
    else
        return(0);
}